

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

int GPU_GetNumActiveRenderers(void)

{
  int local_10;
  int local_c;
  int i;
  int count;
  
  gpu_init_renderer_register();
  local_c = 0;
  for (local_10 = 0; local_10 < 0x14; local_10 = local_10 + 1) {
    if (_gpu_renderer_map[local_10] != (GPU_Renderer *)0x0) {
      local_c = local_c + 1;
    }
  }
  return local_c;
}

Assistant:

int GPU_GetNumActiveRenderers(void)
{
	int count;
	int i;

	gpu_init_renderer_register();

	count = 0;
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		if(_gpu_renderer_map[i] != NULL)
			count++;
	}
	return count;
}